

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_SVM_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LinearKernel>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::LinearKernel> *)
             _LinearKernel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::RBFKernel>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::RBFKernel> *)_RBFKernel_default_instance_
            );
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::PolyKernel>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::PolyKernel> *)
             _PolyKernel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SigmoidKernel>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SigmoidKernel> *)
             _SigmoidKernel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Kernel>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::Kernel> *)_Kernel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SparseNode>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SparseNode> *)
             _SparseNode_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SparseVector>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SparseVector> *)
             _SparseVector_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SparseSupportVectors>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SparseSupportVectors> *)
           _SparseSupportVectors_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::DenseVector>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::DenseVector> *)
             _DenseVector_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::DenseSupportVectors>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::DenseSupportVectors> *)
           _DenseSupportVectors_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Coefficients>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::Coefficients> *)
             _Coefficients_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SupportVectorRegressor>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SupportVectorRegressor> *)
           _SupportVectorRegressor_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SupportVectorClassifier>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::SupportVectorClassifier> *)
             _SupportVectorClassifier_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _LinearKernel_default_instance_.Shutdown();
  _RBFKernel_default_instance_.Shutdown();
  _PolyKernel_default_instance_.Shutdown();
  _SigmoidKernel_default_instance_.Shutdown();
  _Kernel_default_instance_.Shutdown();
  _SparseNode_default_instance_.Shutdown();
  _SparseVector_default_instance_.Shutdown();
  _SparseSupportVectors_default_instance_.Shutdown();
  _DenseVector_default_instance_.Shutdown();
  _DenseSupportVectors_default_instance_.Shutdown();
  _Coefficients_default_instance_.Shutdown();
  _SupportVectorRegressor_default_instance_.Shutdown();
  _SupportVectorClassifier_default_instance_.Shutdown();
}